

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O0

natwm_error workspace_unfocus_client(natwm_state *state,workspace *workspace,client *client)

{
  node *node;
  client *client_00;
  client *next_client;
  node *next_node;
  node *client_node;
  client *client_local;
  workspace *workspace_local;
  natwm_state *state_local;
  
  node = get_client_node_from_client(workspace->clients,client);
  if (node == (node *)0x0) {
    state_local._4_4_ = NOT_FOUND_ERROR;
  }
  else if (node->next == (node *)0x0) {
    state_local._4_4_ = INVALID_INPUT_ERROR;
  }
  else {
    natwm_state_lock(state);
    if ((client->is_focused & 1U) != 0) {
      client_00 = get_client_from_client_node(node->next);
      workspace_focus_client(state,workspace,client_00);
    }
    list_move_node_to_tail(workspace->clients,node);
    natwm_state_unlock(state);
    state_local._4_4_ = NO_ERROR;
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error workspace_unfocus_client(struct natwm_state *state, struct workspace *workspace,
                                          struct client *client)
{
        struct node *client_node = get_client_node_from_client(workspace->clients, client);

        if (client_node == NULL) {
                return NOT_FOUND_ERROR;
        } else if (client_node->next == NULL) {
                return INVALID_INPUT_ERROR;
        }

        natwm_state_lock(state);

        if (client->is_focused) {
                struct node *next_node = client_node->next;
                struct client *next_client = get_client_from_client_node(next_node);

                workspace_focus_client(state, workspace, next_client);
        }

        list_move_node_to_tail(workspace->clients, client_node);

        natwm_state_unlock(state);

        return NO_ERROR;
}